

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

bool __thiscall
cfd::TransactionContext::IsFindTxOut
          (TransactionContext *this,Script *locking_script,uint32_t *index,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indexes)

{
  byte bVar1;
  bool bVar2;
  value_type vVar3;
  size_type sVar4;
  reference pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  value_type *in_RDX;
  Script *in_RSI;
  long *in_RDI;
  CfdException *except;
  uint32_t temp_index;
  uint32_t idx;
  Script *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Script *in_stack_ffffffffffffff60;
  uint local_2c;
  bool local_1;
  
  if (in_RCX == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    vVar3 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI);
    if (in_RDX != (value_type *)0x0) {
      *in_RDX = vVar3;
    }
    local_1 = true;
  }
  else {
    for (local_2c = 0;
        sVar4 = std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::size
                          ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)
                           (in_RDI + 5)), local_2c < (uint)sVar4; local_2c = local_2c + 1) {
      in_stack_ffffffffffffff60 = in_RSI;
      std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::operator[]
                ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)(in_RDI + 5),
                 (ulong)local_2c);
      cfd::core::AbstractTxOut::GetLockingScript();
      bVar1 = cfd::core::Script::Equals(in_stack_ffffffffffffff60);
      core::Script::~Script(in_stack_ffffffffffffff50);
      if ((bVar1 & 1) != 0) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff60,
                   (uint *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
    }
    if ((in_RDX != (value_type *)0x0) &&
       (bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           in_stack_ffffffffffffff60), !bVar2)) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RCX,0);
      *in_RDX = *pvVar5;
    }
    bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_ffffffffffffff60);
    local_1 = (bool)((bVar2 ^ 0xffU) & 1);
  }
  return local_1;
}

Assistant:

bool TransactionContext::IsFindTxOut(
    const Script& locking_script, uint32_t* index,
    std::vector<uint32_t>* indexes) const {
  if (indexes != nullptr) {
    for (uint32_t idx = 0; idx < static_cast<uint32_t>(vout_.size()); ++idx) {
      if (locking_script.Equals(vout_[idx].GetLockingScript())) {
        indexes->emplace_back(idx);
      }
    }
    if ((index != nullptr) && (!indexes->empty())) *index = (*indexes)[0];
    return !indexes->empty();
  }
  try {
    uint32_t temp_index = GetTxOutIndex(locking_script);
    if (index != nullptr) *index = temp_index;
    return true;
  } catch (const CfdException& except) {
    if (except.GetErrorCode() == CfdError::kCfdIllegalArgumentError) {
      return false;
    } else {
      throw except;
    }
  }
}